

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void array_container_intersection
               (array_container_t *array1,array_container_t *array2,array_container_t *out)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  int32_t iVar4;
  size_t size_l;
  uint16_t *large;
  int iVar5;
  uint16_t *small;
  uint16_t *buffer;
  size_t lenB;
  size_t lenA;
  
  iVar1 = array1->cardinality;
  lenA = (size_t)iVar1;
  iVar2 = array2->cardinality;
  lenB = (size_t)iVar2;
  iVar5 = iVar2;
  if (iVar1 < iVar2) {
    iVar5 = iVar1;
  }
  if (out->capacity < iVar5) {
    array_container_grow(out,iVar5 + 8,false);
  }
  if (iVar1 * 0x40 < iVar2) {
    small = array1->array;
    large = array2->array;
    buffer = out->array;
    size_l = lenB;
    lenB = lenA;
  }
  else {
    if (iVar1 <= iVar2 * 0x40) {
      _Var3 = croaring_avx2();
      if (_Var3) {
        iVar4 = intersect_vector16(array1->array,lenA,array2->array,lenB,out->array);
      }
      else {
        iVar4 = intersect_uint16(array1->array,lenA,array2->array,lenB,out->array);
      }
      goto LAB_001037d6;
    }
    small = array2->array;
    large = array1->array;
    buffer = out->array;
    size_l = lenA;
  }
  iVar4 = intersect_skewed_uint16(small,lenB,large,size_l,buffer);
LAB_001037d6:
  out->cardinality = iVar4;
  return;
}

Assistant:

void array_container_intersection(const array_container_t *array1,
                                  const array_container_t *array2,
                                  array_container_t *out) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality,
            min_card = minimum_int32(card_1, card_2);
    const int threshold = 64;  // subject to tuning
#ifdef CROARING_IS_X64
    if (out->capacity < min_card) {
      array_container_grow(out, min_card + sizeof(__m128i) / sizeof(uint16_t),
        false);
    }
#else
    if (out->capacity < min_card) {
      array_container_grow(out, min_card, false);
    }
#endif

    if (card_1 * threshold < card_2) {
        out->cardinality = intersect_skewed_uint16(
            array1->array, card_1, array2->array, card_2, out->array);
    } else if (card_2 * threshold < card_1) {
        out->cardinality = intersect_skewed_uint16(
            array2->array, card_2, array1->array, card_1, out->array);
    } else {
#ifdef CROARING_IS_X64
       if( croaring_avx2() ) {
        out->cardinality = intersect_vector16(
            array1->array, card_1, array2->array, card_2, out->array);
       } else {
        out->cardinality = intersect_uint16(array1->array, card_1,
                                            array2->array, card_2, out->array);
       }
#else
        out->cardinality = intersect_uint16(array1->array, card_1,
                                            array2->array, card_2, out->array);
#endif
    }
}